

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

void Acb_DeriveCnfForNode(Acb_Ntk_t *p,int iObj,sat_solver *pSat,int OutVar)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *vClas_00;
  Vec_Int_t *vLits_00;
  int *piVar3;
  Vec_Int_t *vCnf;
  int *piVar4;
  int local_5c;
  int This;
  int Prev;
  int *pFanins;
  int iFanin;
  int k;
  Vec_Int_t *vLits;
  Vec_Int_t *vClas;
  Vec_Int_t *vFaninVars;
  Vec_Wec_t *vCnfs;
  int OutVar_local;
  sat_solver *pSat_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  p_00 = &p->vCover;
  vClas_00 = Vec_IntAlloc(100);
  vLits_00 = Vec_IntAlloc(100);
  Vec_IntClear(p_00);
  pFanins._4_4_ = 0;
  piVar3 = Acb_ObjFanins(p,iObj);
  while( true ) {
    if (*piVar3 <= pFanins._4_4_) {
      Vec_IntPush(p_00,OutVar);
      vCnf = Vec_WecEntry(&p->vCnfs,iObj);
      Acb_TranslateCnf(vClas_00,vLits_00,(Vec_Str_t *)vCnf,p_00,-1);
      local_5c = 0;
      for (pFanins._4_4_ = 0; iVar1 = Vec_IntSize(vClas_00), pFanins._4_4_ < iVar1;
          pFanins._4_4_ = pFanins._4_4_ + 1) {
        iVar1 = Vec_IntEntry(vClas_00,pFanins._4_4_);
        piVar3 = Vec_IntArray(vLits_00);
        piVar4 = Vec_IntArray(vLits_00);
        iVar2 = sat_solver_addclause(pSat,piVar3 + local_5c,piVar4 + iVar1);
        if (iVar2 == 0) {
          printf("Error: SAT solver became UNSAT at a wrong place (while adding new CNF).\n");
        }
        local_5c = iVar1;
      }
      Vec_IntFree(vClas_00);
      Vec_IntFree(vLits_00);
      return;
    }
    iVar1 = piVar3[pFanins._4_4_ + 1];
    iVar2 = Acb_ObjFunc(p,iVar1);
    if (iVar2 < 0) break;
    iVar1 = Acb_ObjFunc(p,iVar1);
    Vec_IntPush(p_00,iVar1);
    pFanins._4_4_ = pFanins._4_4_ + 1;
  }
  __assert_fail("Acb_ObjFunc(p, iFanin) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                ,0xad,"void Acb_DeriveCnfForNode(Acb_Ntk_t *, int, sat_solver *, int)");
}

Assistant:

void Acb_DeriveCnfForNode( Acb_Ntk_t * p, int iObj, sat_solver * pSat, int OutVar )
{
    Vec_Wec_t * vCnfs = &p->vCnfs;
    Vec_Int_t * vFaninVars = &p->vCover;
    Vec_Int_t * vClas = Vec_IntAlloc( 100 );
    Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int k, iFanin, * pFanins, Prev, This;
    // collect SAT variables
    Vec_IntClear( vFaninVars );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        assert( Acb_ObjFunc(p, iFanin) >= 0 );
        Vec_IntPush( vFaninVars, Acb_ObjFunc(p, iFanin) );
    }
    Vec_IntPush( vFaninVars, OutVar );
    // derive CNF for the node
    Acb_TranslateCnf( vClas, vLits, (Vec_Str_t *)Vec_WecEntry(vCnfs, iObj), vFaninVars, -1 );
    // add clauses
    Prev = 0;
    Vec_IntForEachEntry( vClas, This, k )
    {
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits) + Prev, Vec_IntArray(vLits) + This ) )
            printf( "Error: SAT solver became UNSAT at a wrong place (while adding new CNF).\n" );
        Prev = This;
    }
    Vec_IntFree( vClas );
    Vec_IntFree( vLits );
}